

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

matches * atomctarg(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  int iVar1;
  expr *peVar2;
  ull uVar3;
  expr **ppeVar4;
  char *pcVar5;
  ull *in_RCX;
  disctx *in_RDI;
  undefined4 in_R8D;
  expr *expr_1;
  int i;
  expr *expr;
  bitfield *bf;
  int in_stack_ffffffffffffffac;
  bitfield *in_stack_ffffffffffffffb0;
  etype type;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffd0;
  matches *local_8;
  
  if (in_RDI->reverse == 0) {
    peVar2 = makeex((etype)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    type = (etype)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
    uVar3 = getbf((bitfield *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),in_RCX,(ull *)peVar2,
                  (disctx *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    peVar2->num1 = uVar3;
    mark(in_RDI,(uint32_t)peVar2->num1,2);
    iVar1 = is_nr_mark(in_RDI,(uint32_t)peVar2->num1);
    if (iVar1 != 0) {
      in_RDI->endmark = 1;
    }
    peVar2->special = 2;
    if (in_RDI->atomsmax <= in_RDI->atomsnum) {
      if (in_RDI->atomsmax == 0) {
        in_RDI->atomsmax = 0x10;
      }
      else {
        in_RDI->atomsmax = in_RDI->atomsmax << 1;
      }
      ppeVar4 = (expr **)realloc(in_RDI->atoms,(long)in_RDI->atomsmax << 3);
      in_RDI->atoms = ppeVar4;
    }
    iVar1 = in_RDI->atomsnum;
    in_RDI->atomsnum = iVar1 + 1;
    in_RDI->atoms[iVar1] = peVar2;
    for (iVar1 = 0; iVar1 < in_RDI->labelsnum; iVar1 = iVar1 + 1) {
      if ((in_RDI->labels[iVar1].val == peVar2->num1) && (in_RDI->labels[iVar1].name != (char *)0x0)
         ) {
        peVar2 = makeex(type);
        pcVar5 = strdup(in_RDI->labels[iVar1].name);
        peVar2->str = pcVar5;
        peVar2->special = 2;
        if (in_RDI->atomsmax <= in_RDI->atomsnum) {
          if (in_RDI->atomsmax == 0) {
            in_RDI->atomsmax = 0x10;
          }
          else {
            in_RDI->atomsmax = in_RDI->atomsmax << 1;
          }
          ppeVar4 = (expr **)realloc(in_RDI->atoms,(long)in_RDI->atomsmax << 3);
          in_RDI->atoms = ppeVar4;
        }
        iVar1 = in_RDI->atomsnum;
        in_RDI->atomsnum = iVar1 + 1;
        in_RDI->atoms[iVar1] = peVar2;
        return (matches *)0x0;
      }
    }
    local_8 = (matches *)0x0;
  }
  else {
    local_8 = matchimm((disctx *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  }
  return local_8;
}

Assistant:

struct matches *atomctarg APROTO {
	const struct bitfield *bf = v;
	if (ctx->reverse)
		return matchimm(ctx, bf, spos);
	struct expr *expr = makeex(EXPR_NUM);
	expr->num1 = GETBF(bf);
	mark(ctx, expr->num1, 2);
	if (is_nr_mark(ctx, expr->num1))
		ctx->endmark = 1;
	expr->special = 2;
	ADDARRAY(ctx->atoms, expr);
	int i;
	for (i = 0; i < ctx->labelsnum; i++) {
		if (ctx->labels[i].val == expr->num1 && ctx->labels[i].name) {
			struct expr *expr = makeex(EXPR_LABEL);
			expr->str = strdup(ctx->labels[i].name);
			expr->special = 2;
			ADDARRAY(ctx->atoms, expr);
			return NULL;
		}
	}
	return NULL;
}